

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicAllTargetsLoadFS::Cleanup(BasicAllTargetsLoadFS *this)

{
  int width;
  int height;
  BasicAllTargetsLoadFS *this_local;
  
  width = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
  height = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,width,height);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_vbo);
		return NO_ERROR;
	}